

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

D_Scope * commit_D_Scope(D_Scope *st)

{
  D_Scope *local_20;
  D_Scope *x;
  D_Scope *st_local;
  
  local_20 = st;
  st_local = st;
  if (st->up == (D_Scope *)0x0) {
    for (; local_20->search != (D_Scope *)0x0; local_20 = local_20->search) {
    }
    commit_ll(st,local_20->hash);
    commit_update(st,local_20->hash);
    st_local = local_20;
  }
  return st_local;
}

Assistant:

D_Scope *commit_D_Scope(D_Scope *st) {
  D_Scope *x = st;
  if (st->up) return st;
  while (x->search) x = x->search;
  commit_ll(st, x->hash);
  commit_update(st, x->hash);
  return x;
}